

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateEmbeddingLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  WeightParams *weights;
  WeightParams *bias;
  Result local_160;
  EmbeddingLayerParams *local_138;
  EmbeddingLayerParams *params;
  string local_128;
  Result local_108;
  allocator local_d9;
  string local_d8;
  Result local_b8;
  Result local_88;
  Result local_50;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,1,1);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
  }
  bVar2 = Result::good(__return_storage_ptr__);
  pNVar1 = local_20;
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d8,"Embedding",&local_d9);
    validateInputOutputRankEquality(&local_b8,pNVar1,&local_d8,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_b8);
    Result::~Result(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    bVar2 = Result::good(__return_storage_ptr__);
    pNVar1 = local_20;
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_128,"Embedding",(allocator *)((long)&params + 7));
    validateRankCount(&local_108,pNVar1,&local_128,4,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,&local_108);
    Result::~Result(&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
  }
  local_138 = Specification::NeuralNetworkLayer::embedding(local_20);
  pNVar1 = local_20;
  weights = Specification::EmbeddingLayerParams::weights(local_138);
  bias = Specification::EmbeddingLayerParams::bias(local_138);
  validateEmbeddingWeightsBias(&local_160,pNVar1,weights,bias);
  Result::operator=(__return_storage_ptr__,&local_160);
  Result::~Result(&local_160);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateEmbeddingLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    if (!r.good()) {
        return r;
    }

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Embedding", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "Embedding", 4, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.embedding();
    r = validateEmbeddingWeightsBias(layer, params.weights(), params.bias());

    return r;
}